

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

int strbin(char *str)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  byte *pbVar9;
  bool bVar10;
  
  iVar5 = (int)str;
  pbVar6 = (byte *)str;
  do {
    while( true ) {
      pbVar7 = pbVar6 + 1;
      bVar8 = *pbVar6;
      if (bVar8 == 0x5c) break;
      if (bVar8 == 0) {
        *str = 0;
        return (int)str - iVar5;
      }
      *str = bVar8;
      str = (char *)((byte *)str + 1);
      pbVar6 = pbVar7;
    }
    bVar8 = *pbVar7;
    if (bVar8 - 0x30 < 8) {
      bVar8 = 0;
      for (lVar3 = 1; pbVar9 = pbVar6 + 4, (int)lVar3 != 4; lVar3 = lVar3 + 1) {
        bVar8 = bVar8 * '\b';
        if ((pbVar6[lVar3] & 0xf8) != 0x30) {
          pbVar9 = pbVar6 + lVar3;
          break;
        }
        bVar8 = (pbVar6[lVar3] + bVar8) - 0x30;
      }
      goto switchD_0042d182_caseD_64;
    }
    pbVar9 = pbVar7;
    switch(bVar8) {
    case 0x6e:
      bVar8 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      break;
    case 0x72:
      bVar8 = 0xd;
      break;
    case 0x74:
      bVar8 = 9;
      break;
    case 0x76:
      bVar8 = 0xb;
      break;
    case 0x78:
switchD_0042d1c4_caseD_78:
      bVar8 = 0;
      iVar2 = 2;
      while (bVar10 = iVar2 != 0, iVar2 = iVar2 + -1, pbVar9 = pbVar6 + 3, bVar10) {
        bVar1 = pbVar7[1];
        cVar4 = -0x30;
        if (((9 < (byte)(bVar1 - 0x30)) && (cVar4 = -0x57, 5 < (byte)(bVar1 + 0x9f))) &&
           (cVar4 = -0x37, pbVar9 = pbVar7, 5 < (byte)(bVar1 + 0xbf))) break;
        pbVar7 = pbVar7 + 1;
        bVar8 = bVar8 * '\x10' + cVar4 + bVar1;
      }
      break;
    default:
      switch(bVar8) {
      case 0x61:
        bVar8 = 7;
        break;
      case 0x62:
        bVar8 = 8;
        break;
      case 99:
        bVar8 = 0x1c;
        break;
      case 100:
      case 0x65:
        break;
      case 0x66:
        bVar8 = 0xc;
        break;
      default:
        if (bVar8 != 10) {
          if ((bVar8 != 0x3f) && (bVar8 == 0x58)) goto switchD_0042d1c4_caseD_78;
          break;
        }
        goto LAB_0042d1d7;
      }
    }
switchD_0042d182_caseD_64:
    *str = bVar8;
    str = (char *)((byte *)str + 1);
LAB_0042d1d7:
    pbVar6 = pbVar9 + 1;
  } while( true );
}

Assistant:

int strbin (char *str)
{
	char *start = str;
	char *p = str, c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			*str++ = c;
		} else {
			switch (*p) {
				case 'a':
					*str++ = '\a';
					break;
				case 'b':
					*str++ = '\b';
					break;
				case 'c':
					*str++ = '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					*str++ = '\f';
					break;
				case 'n':
					*str++ = '\n';
					break;
				case 't':
					*str++ = '\t';
					break;
				case 'r':
					*str++ = '\r';
					break;
				case 'v':
					*str++ = '\v';
					break;
				case '?':
					*str++ = '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					*str++ = c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
							break;
						p++;
					}
					*str++ = c;
					break;
				default:
					*str++ = *p;
					break;
			}
			p++;
		}
	}
	*str = 0;
	return int(str - start);
}